

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::BoxRenderer::TryFormatLargeNumber
          (string *__return_storage_ptr__,BoxRenderer *this,string *numeric)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  string local_90 [32];
  string unit;
  string decimal_str;
  
  if (numeric->_M_string_length < 6) {
LAB_017a4e37:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar3 = (numeric->_M_dataplus)._M_p;
    cVar1 = *pcVar3;
    uVar6 = 0;
    for (uVar5 = (ulong)(cVar1 == '-');
        (numeric->_M_string_length != uVar5 && (cVar2 = pcVar3[uVar5], cVar2 != '.'));
        uVar5 = uVar5 + 1) {
      if (((byte)(cVar2 - 0x3aU) < 0xf6) || (999999999999999999 < uVar6)) goto LAB_017a4e37;
      uVar6 = (ulong)(byte)(cVar2 - 0x30) + uVar6 * 10;
    }
    unit._M_dataplus._M_p = (pointer)&unit.field_2;
    unit._M_string_length = 0;
    unit.field_2._M_local_buf[0] = '\0';
    uVar5 = 0;
    for (lVar7 = 8; lVar7 != 0x58; lVar7 = lVar7 + 0x10) {
      uVar4 = *(ulong *)((long)&PTR___cxa_pure_virtual_027a69d8 + lVar7);
      if (uVar4 <= uVar4 / 200 + uVar6) {
        ::std::__cxx11::string::assign((char *)&unit);
        uVar5 = uVar4;
      }
    }
    if (unit._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      ::std::__cxx11::to_string((string *)&decimal_str,(uVar5 / 200 + uVar6) / (uVar5 / 100));
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (cVar1 == '-') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)local_90,(ulong)&decimal_str);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string(local_90);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      ::std::__cxx11::string::substr((ulong)local_90,(ulong)&decimal_str);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string(local_90);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&decimal_str);
    }
    ::std::__cxx11::string::~string((string *)&unit);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::TryFormatLargeNumber(const string &numeric) {
	// we only return a readable rendering if the number is > 1 million
	if (numeric.size() <= 5) {
		// number too small for sure
		return string();
	}
	// get the number to summarize
	idx_t number = 0;
	bool negative = false;
	idx_t i = 0;
	if (numeric[0] == '-') {
		negative = true;
		i++;
	}
	for (; i < numeric.size(); i++) {
		char c = numeric[i];
		if (c == '.') {
			break;
		}
		if (c < '0' || c > '9') {
			// not a number or something funky (e.g. 1.23e7)
			// we could theoretically summarize numbers with exponents
			return string();
		}
		if (number >= 1000000000000000000ULL) {
			// number too big
			return string();
		}
		number = number * 10 + static_cast<idx_t>(c - '0');
	}
	struct UnitBase {
		idx_t base;
		const char *name;
	};
	static constexpr idx_t BASE_COUNT = 5;
	UnitBase bases[] = {{1000000ULL, "million"},
	                    {1000000000ULL, "billion"},
	                    {1000000000000ULL, "trillion"},
	                    {1000000000000000ULL, "quadrillion"},
	                    {1000000000000000000ULL, "quintillion"}};
	idx_t base = 0;
	string unit;
	for (idx_t i = 0; i < BASE_COUNT; i++) {
		// round the number according to this base
		idx_t rounded_number = number + ((bases[i].base / 100ULL) / 2);
		if (rounded_number >= bases[i].base) {
			base = bases[i].base;
			unit = bases[i].name;
		}
	}
	if (unit.empty()) {
		return string();
	}
	number += (base / 100ULL) / 2;
	idx_t decimal_unit = number / (base / 100ULL);
	string decimal_str = to_string(decimal_unit);
	string result;
	if (negative) {
		result += "-";
	}
	result += decimal_str.substr(0, decimal_str.size() - 2);
	result += config.decimal_separator == '\0' ? '.' : config.decimal_separator;
	result += decimal_str.substr(decimal_str.size() - 2, 2);
	result += " ";
	result += unit;
	return result;
}